

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

ON_Layer * __thiscall ON_ClassArray<ON_Layer>::AppendNew(ON_ClassArray<ON_Layer> *this)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  
  uVar1 = *(uint *)(this + 0x10);
  if (uVar1 == *(uint *)(this + 0x14)) {
    if (((int)uVar1 < 8) || ((ulong)((long)(int)uVar1 * 0xe8) < 0x10000001)) {
      uVar4 = 4;
      if (2 < (int)uVar1) {
        uVar4 = uVar1 * 2;
      }
    }
    else {
      uVar4 = 0x11a7c1;
      if ((int)uVar1 < 0x11a7c1) {
        uVar4 = uVar1;
      }
      uVar4 = uVar4 + uVar1;
    }
    if (*(uint *)(this + 0x14) < uVar4) {
      SetCapacity(this,(long)(int)uVar4);
    }
  }
  else {
    lVar3 = (long)(int)uVar1 * 0xe8;
    (**(code **)(*(long *)(*(long *)(this + 8) + lVar3) + 0x18))(*(long *)(this + 8) + lVar3);
    ON_Layer::ON_Layer((ON_Layer *)((long)*(int *)(this + 0x10) * 0xe8 + *(long *)(this + 8)));
  }
  iVar2 = *(int *)(this + 0x10);
  *(int *)(this + 0x10) = iVar2 + 1;
  return (ON_Layer *)((long)iVar2 * 0xe8 + *(long *)(this + 8));
}

Assistant:

T& ON_ClassArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int newcapacity = NewCapacity();
    Reserve( newcapacity );
  }
  else
  {
    // First destroy what's there ..
    DestroyElement(m_a[m_count]);
    // and then get a properly initialized element
    ConstructDefaultElement(&m_a[m_count]);
  }
  return m_a[m_count++];
}